

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall IRBuilder::BuildInitCachedScope(IRBuilder *this,int auxOffset,int offset)

{
  PropertyId objectId;
  RegSlot dstRegSlot;
  Func *curFunc;
  JITTimeFunctionBody *pJVar1;
  intptr_t address;
  AddrOpnd *src1Opnd;
  PropertyIdArray *propIds;
  Opnd *src1Opnd_00;
  RegOpnd *dstOpnd;
  IntConstOpnd *src1Opnd_01;
  RegOpnd *pRVar2;
  Instr *pIVar3;
  Func *pFVar4;
  Instr *instr;
  RegOpnd *dstOpnd_00;
  
  pJVar1 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  address = JITTimeFunctionBody::GetFormalsPropIdArrayAddr(pJVar1);
  src1Opnd = IR::AddrOpnd::New(address,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0);
  pJVar1 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  propIds = JITTimeFunctionBody::GetFormalsPropIdArray(pJVar1);
  objectId = Js::ActivationObjectEx::GetLiteralObjectRef(propIds);
  src1Opnd_00 = BuildAuxObjectLiteralTypeRefOpnd(this,objectId);
  pJVar1 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  dstRegSlot = JITTimeFunctionBody::GetLocalClosureReg(pJVar1);
  dstOpnd = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
  src1Opnd_01 = IR::IntConstOpnd::New((ulong)propIds->hasNonSimpleParams,TyUint8,this->m_func,false)
  ;
  pRVar2 = IR::RegOpnd::New(TyVar,this->m_func);
  pIVar3 = IR::Instr::New(ExtendArg_A,&pRVar2->super_Opnd,&src1Opnd_01->super_Opnd,this->m_func);
  AddInstr(this,pIVar3,offset);
  pRVar2 = IR::RegOpnd::New(TyVar,this->m_func);
  pIVar3 = IR::Instr::New(ExtendArg_A,&pRVar2->super_Opnd,src1Opnd_00,pIVar3->m_dst,this->m_func);
  AddInstr(this,pIVar3,0xffffffff);
  pRVar2 = IR::RegOpnd::New(TyVar,this->m_func);
  pIVar3 = IR::Instr::New(ExtendArg_A,&pRVar2->super_Opnd,&src1Opnd->super_Opnd,pIVar3->m_dst,
                          this->m_func);
  AddInstr(this,pIVar3,0xffffffff);
  pFVar4 = this->m_func;
  do {
    *(uint *)&pFVar4->field_0x240 = *(uint *)&pFVar4->field_0x240 & 0xfffff7fd;
    pFVar4->frameInfo = (InlineeFrameInfo *)0x0;
    pFVar4 = pFVar4->parentFunc;
  } while (pFVar4 != (Func *)0x0);
  pRVar2 = IR::RegOpnd::New(TyVar,this->m_func);
  instr = IR::Instr::New(LdFuncExpr,&pRVar2->super_Opnd,this->m_func);
  AddInstr(this,instr,0xffffffff);
  dstOpnd_00 = IR::RegOpnd::New(TyVar,this->m_func);
  pIVar3 = IR::Instr::New(ExtendArg_A,&dstOpnd_00->super_Opnd,&pRVar2->super_Opnd,pIVar3->m_dst,
                          this->m_func);
  AddInstr(this,pIVar3,0xffffffff);
  pIVar3 = IR::Instr::New(InitCachedScope,&dstOpnd->super_Opnd,pIVar3->m_dst,this->m_func);
  AddInstr(this,pIVar3,0xffffffff);
  return;
}

Assistant:

void IRBuilder::BuildInitCachedScope(int auxOffset, int offset)
{
    IR::Instr *     instr;
    IR::RegOpnd *   dstOpnd;
    IR::RegOpnd *   src1Opnd;
    IR::AddrOpnd *  src2Opnd;
    IR::Opnd*       src3Opnd;
    IR::Opnd*       formalsAreLetDeclOpnd;

    src2Opnd = IR::AddrOpnd::New(m_func->GetJITFunctionBody()->GetFormalsPropIdArrayAddr(), IR::AddrOpndKindDynamicMisc, m_func);
    Js::PropertyIdArray * propIds = m_func->GetJITFunctionBody()->GetFormalsPropIdArray();
    src3Opnd = this->BuildAuxObjectLiteralTypeRefOpnd(Js::ActivationObjectEx::GetLiteralObjectRef(propIds));
    dstOpnd = this->BuildDstOpnd(m_func->GetJITFunctionBody()->GetLocalClosureReg());

    formalsAreLetDeclOpnd = IR::IntConstOpnd::New(propIds->hasNonSimpleParams, TyUint8, m_func);

    instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), formalsAreLetDeclOpnd, m_func);
    this->AddInstr(instr, offset);

    instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src3Opnd, instr->GetDst(), m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

    instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src2Opnd, instr->GetDst(), m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

    // Disable opt that normally gets disabled when we see LdFuncExpr in the byte code.
    m_func->DisableCanDoInlineArgOpt();
    src1Opnd = IR::RegOpnd::New(TyVar, m_func);
    IR::Instr * instrLdFuncExpr = IR::Instr::New(Js::OpCode::LdFuncExpr, src1Opnd, m_func);
    this->AddInstr(instrLdFuncExpr, Js::Constants::NoByteCodeOffset);

    instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src1Opnd, instr->GetDst(), m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

    instr = IR::Instr::New(Js::OpCode::InitCachedScope, dstOpnd, instr->GetDst(), m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
}